

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseSubstitution(State *state)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  State copy;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  pcVar1 = state->mangled_cur;
  if (*pcVar1 == 'S') {
    if (pcVar1[1] == '_') {
      state->mangled_cur = pcVar1 + 2;
LAB_00118ad7:
      MaybeAppend(state,"?");
      return true;
    }
    local_48 = state->mangled_cur;
    pcStack_40 = state->out_cur;
    local_38 = state->out_begin;
    pcStack_30 = state->out_end;
    local_28 = state->prev_name;
    uStack_20._0_4_ = state->prev_name_length;
    uStack_20._4_2_ = state->nest_level;
    uStack_20._6_1_ = state->append;
    uStack_20._7_1_ = state->overflowed;
    state->mangled_cur = pcVar1 + 1;
    cVar4 = pcVar1[1];
    if (cVar4 != '\0') {
      lVar3 = 1;
      do {
        if (9 < (byte)(cVar4 - 0x30U) && 0x19 < (byte)(cVar4 + 0xbfU)) {
          if (lVar3 == 1) goto LAB_00118b04;
          break;
        }
        cVar4 = pcVar1[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (cVar4 != '\0');
      state->mangled_cur = pcVar1 + lVar3;
      if (pcVar1[lVar3] == '_') {
        state->mangled_cur = pcVar1 + lVar3 + 1;
        goto LAB_00118ad7;
      }
    }
  }
  else {
    local_48 = state->mangled_cur;
    pcStack_40 = state->out_cur;
    local_38 = state->out_begin;
    pcStack_30 = state->out_end;
    local_28 = state->prev_name;
    uStack_20._0_4_ = state->prev_name_length;
    uStack_20._4_2_ = state->nest_level;
    uStack_20._6_1_ = state->append;
    uStack_20._7_1_ = state->overflowed;
  }
LAB_00118b04:
  state->mangled_cur = local_48;
  state->out_cur = pcStack_40;
  state->prev_name = local_28;
  state->prev_name_length = (undefined4)uStack_20;
  state->nest_level = uStack_20._4_2_;
  state->append = (bool)uStack_20._6_1_;
  state->overflowed = (bool)uStack_20._7_1_;
  state->out_begin = local_38;
  state->out_end = pcStack_30;
  pcVar1 = state->mangled_cur;
  if (*pcVar1 == 'S') {
    state->mangled_cur = pcVar1 + 1;
    pcVar2 = "St";
    plVar5 = (long *)(kSubstitutionList + 0x10);
    do {
      if (pcVar1[1] == pcVar2[1]) {
        MaybeAppend(state,"std");
        pcVar1 = (char *)plVar5[-1];
        if (*pcVar1 != '\0') {
          MaybeAppend(state,"::");
          MaybeAppend(state,pcVar1);
        }
        state->mangled_cur = state->mangled_cur + 1;
        return true;
      }
      pcVar2 = (char *)*plVar5;
      plVar5 = plVar5 + 2;
    } while (pcVar2 != (char *)0x0);
  }
  state->prev_name = local_28;
  state->prev_name_length = (undefined4)uStack_20;
  state->nest_level = uStack_20._4_2_;
  state->append = (bool)uStack_20._6_1_;
  state->overflowed = (bool)uStack_20._7_1_;
  state->out_begin = local_38;
  state->out_end = pcStack_30;
  state->mangled_cur = local_48;
  state->out_cur = pcStack_40;
  return false;
}

Assistant:

static bool ParseSubstitution(State *state) {
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  *state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != NULL; ++p) {
      if (state->mangled_cur[0] == p->abbrev[1]) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->mangled_cur;
        return true;
      }
    }
  }
  *state = copy;
  return false;
}